

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Functional::LineNumSamplesCase::renderPattern(LineNumSamplesCase *this)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float in_XMM0_Db;
  float extraout_XMM0_Db;
  float in_XMM0_Dc;
  float extraout_XMM0_Dc;
  float in_XMM0_Dd;
  float extraout_XMM0_Dd;
  Vec2 local_78;
  Vec2 local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  Vector<float,_4> local_40;
  
  fVar3 = (float)(this->super_NumSamplesCase).super_MultisampleCase.m_viewportSize * 0.00390625;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
    in_XMM0_Db = extraout_XMM0_Db;
    in_XMM0_Dc = extraout_XMM0_Dc;
    in_XMM0_Dd = extraout_XMM0_Dd;
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  iVar1 = (int)(fVar3 * 100.0);
  iVar2 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  local_68 = (float)(int)(fVar3 * 100.0);
  fStack_64 = (float)(int)in_XMM0_Db;
  fStack_60 = (float)(int)in_XMM0_Dc;
  fStack_5c = (float)(int)in_XMM0_Dd;
  for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    fVar3 = (float)(this->super_NumSamplesCase).m_currentIteration * 0.001 +
            ((float)iVar2 * 6.2831855) / local_68;
    local_70.m_data[0] = 0.0;
    local_70.m_data[1] = 0.0;
    local_58 = cosf(fVar3);
    fVar3 = sinf(fVar3);
    local_78.m_data[1] = fVar3 * (float)0x3f733333;
    local_78.m_data[0] = local_58 * (float)0x3f733333;
    tcu::Vector<float,_4>::Vector(&local_40,1.0);
    MultisampleCase::renderLine((MultisampleCase *)this,&local_70,&local_78,&local_40);
  }
  return;
}

Assistant:

void LineNumSamplesCase::renderPattern (void) const
{
	// The test pattern consists of several lines at different angles.

	// We scale the number of lines based on the viewport size. This is because a gl line's thickness is
	// constant in pixel units, i.e. they get relatively thicker as viewport size decreases. Thus we must
	// decrease the number of lines in order to decrease the extent of overlap among the lines in the
	// center of the pattern.
	const int numLines = (int)(100.0f * deFloatSqrt((float)m_viewportSize / 256.0f));

	for (int i = 0; i < numLines; i++)
	{
		float angle = 2.0f*DE_PI * (float)i / (float)numLines + 0.001f*(float)m_currentIteration;
		renderLine(Vec2(0.0f, 0.0f), Vec2(deFloatCos(angle)*0.95f, deFloatSin(angle)*0.95f), Vec4(1.0f));
	}
}